

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall BloatyTest::CheckConsistency(BloatyTest *this,Options *options)

{
  bool bVar1;
  int iVar2;
  pointer pRVar3;
  Options *in_RSI;
  char *in_RDI;
  AssertionResult gtest_ar_2;
  int rows;
  AssertionResult gtest_ar_1;
  int *in_stack_00000078;
  bool in_stack_00000086;
  bool in_stack_00000087;
  RollupRow *in_stack_00000088;
  BloatyTest *in_stack_00000090;
  AssertionResult gtest_ar_;
  uint64_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  size_t total_input_size;
  AssertionResult gtest_ar;
  int in_stack_000003ac;
  BloatyTest *in_stack_000003b0;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec8;
  AssertionResult *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  string *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  Type in_stack_fffffffffffffefc;
  AssertHelper *in_stack_ffffffffffffff00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  AssertionResult *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_90;
  long local_80;
  reference local_78;
  iterator local_70;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  long local_58;
  uint local_4c;
  undefined1 local_22;
  undefined1 local_21;
  AssertionResult local_20;
  Options *local_10;
  
  local_10 = in_RSI;
  iVar2 = bloaty::Options::base_filename_size((Options *)0x17afd1);
  local_21 = 0 < iVar2;
  pRVar3 = std::unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>::
           operator->((unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                       *)0x17afee);
  local_22 = bloaty::RollupOutput::diff_mode(pRVar3);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_RDI,in_stack_fffffffffffffee0,(bool *)in_stack_fffffffffffffed8,
             &in_stack_fffffffffffffed0->success_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    in_stack_fffffffffffffee0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x17b05e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
               (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x17b0bb);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b142);
  if (local_4c == 0) {
    pRVar3 = std::unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>::
             operator->((unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                         *)0x17b162);
    bVar1 = bloaty::RollupOutput::diff_mode(pRVar3);
    if (!bVar1) {
      local_58 = 0;
      local_60 = bloaty::Options::filename_abi_cxx11_(local_10);
      local_68.it_ = (void **)google::protobuf::
                              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::begin(in_stack_fffffffffffffec8);
      local_70.it_ = (void **)google::protobuf::
                              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffffed8);
      while (bVar1 = google::protobuf::internal::
                     RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator!=(&local_68,&local_70), bVar1) {
        local_78 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
        GetFileSize(in_stack_fffffffffffffed8,(uint64_t *)in_stack_fffffffffffffed0);
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffed0,(bool *)in_stack_fffffffffffffec8,(type *)0x17b227);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff00);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     (char *)in_stack_ffffffffffffff30._M_head_impl);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                     (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffee0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
          testing::Message::~Message((Message *)0x17b2f1);
        }
        local_4c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b398);
        if (local_4c != 0) {
          return;
        }
        local_58 = local_80 + local_58;
        google::protobuf::internal::
        RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_68);
      }
      testing::internal::EqHelper::Compare<long,_unsigned_long,_nullptr>
                (in_RDI,in_stack_fffffffffffffee0,(long *)in_stack_fffffffffffffed8,
                 (unsigned_long *)in_stack_fffffffffffffed0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff28);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff00);
        in_stack_fffffffffffffed8 =
             (string *)testing::AssertionResult::failure_message((AssertionResult *)0x17b442);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                   (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffee0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
        testing::Message::~Message((Message *)0x17b490);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b508);
      if (local_4c != 0) {
        return;
      }
    }
    rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x18);
    pRVar3 = std::unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>::
             operator->((unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                         *)0x17b54a);
    bloaty::RollupOutput::diff_mode(pRVar3);
    CheckConsistencyForRow
              (in_stack_00000090,in_stack_00000088,in_stack_00000087,in_stack_00000086,
               in_stack_00000078);
    CheckCSVConsistency(in_stack_000003b0,in_stack_000003ac);
    testing::internal::EqHelper::
    Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (in_RDI,in_stack_fffffffffffffee0,(char (*) [6])in_stack_fffffffffffffed8,rhs);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff00);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff00);
      testing::AssertionResult::failure_message((AssertionResult *)0x17b5d2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,iVar2
                 ,in_stack_fffffffffffffee0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)rhs);
      testing::Message::~Message((Message *)0x17b61e);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b696);
  }
  return;
}

Assistant:

void CheckConsistency(const bloaty::Options& options) {
    ASSERT_EQ(options.base_filename_size() > 0, output_->diff_mode());

    if (!output_->diff_mode()) {
      size_t total_input_size = 0;
      for (const auto& filename : options.filename()) {
        uint64_t size;
        ASSERT_TRUE(GetFileSize(filename, &size));
        total_input_size += size;
      }
      ASSERT_EQ(top_row_->size.file, total_input_size);
    }

    int rows = 0;
    CheckConsistencyForRow(*top_row_, true, output_->diff_mode(), &rows);
    CheckCSVConsistency(rows);
    ASSERT_EQ("TOTAL", top_row_->name);
  }